

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.cpp
# Opt level: O1

void __thiscall
duckdb::ZSTDScanState::DecompressString
          (ZSTDScanState *this,ZSTDVectorScanState *scan_state,data_ptr_t destination,
          idx_t uncompressed_length)

{
  size_t sVar1;
  uint uVar2;
  size_t code;
  InvalidInputException *this_00;
  char *params;
  ZSTD_outBuffer out_buffer;
  ZSTD_outBuffer local_68;
  string local_50;
  
  if (uncompressed_length != 0) {
    local_68.pos = 0;
    sVar1 = (scan_state->in_buffer).pos;
    local_68.dst = destination;
    local_68.size = uncompressed_length;
    code = duckdb_zstd::ZSTD_decompressStream
                     (this->decompression_context,&local_68,&scan_state->in_buffer);
    scan_state->compressed_scan_count =
         scan_state->compressed_scan_count + ((scan_state->in_buffer).pos - sVar1);
    uVar2 = duckdb_zstd::ZSTD_isError(code);
    while( true ) {
      if (uVar2 != 0) {
        this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"ZSTD Decompression failed: %s","");
        params = duckdb_zstd::ZSTD_getErrorName(code);
        InvalidInputException::InvalidInputException<char_const*>(this_00,&local_50,params);
        __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (local_68.pos == local_68.size) break;
      LoadNextPageForVector(this,scan_state);
      sVar1 = (scan_state->in_buffer).pos;
      code = duckdb_zstd::ZSTD_decompressStream
                       (this->decompression_context,&local_68,&scan_state->in_buffer);
      scan_state->compressed_scan_count =
           scan_state->compressed_scan_count + ((scan_state->in_buffer).pos - sVar1);
      uVar2 = duckdb_zstd::ZSTD_isError(code);
    }
  }
  return;
}

Assistant:

void DecompressString(ZSTDVectorScanState &scan_state, data_ptr_t destination, idx_t uncompressed_length) {
		if (uncompressed_length == 0) {
			return;
		}

		duckdb_zstd::ZSTD_outBuffer out_buffer;

		out_buffer.dst = destination;
		out_buffer.pos = 0;
		out_buffer.size = uncompressed_length;

		while (true) {
			idx_t old_pos = scan_state.in_buffer.pos;
			size_t res = duckdb_zstd::ZSTD_decompressStream(
			    /* zds = */ decompression_context,
			    /* output =*/&out_buffer,
			    /* input =*/&scan_state.in_buffer);
			scan_state.compressed_scan_count += scan_state.in_buffer.pos - old_pos;
			if (duckdb_zstd::ZSTD_isError(res)) {
				throw InvalidInputException("ZSTD Decompression failed: %s", duckdb_zstd::ZSTD_getErrorName(res));
			}
			if (out_buffer.pos == out_buffer.size) {
				break;
			}
			// Did not fully decompress, it needs a new page to read from
			LoadNextPageForVector(scan_state);
		}
	}